

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

text * lest::of_type(text *__return_storage_ptr__,text *type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"of type ",type);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_30);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

inline text of_type( text type )
{
    return "of type " + type;
}